

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cc
# Opt level: O2

bool rcg::isFormatSupported(uint64_t pixelformat,bool only_color)

{
  bool bVar1;
  
  bVar1 = true;
  if (((((3 < pixelformat - 0x1080008) && (pixelformat != 0x20c005a)) && (pixelformat != 0x2100032))
      && ((pixelformat != 0x210003b && (pixelformat != 0x2180014)))) &&
     ((only_color ||
      (((pixelformat != 0x1080001 && (pixelformat != 0x10800c6)) && (pixelformat != 0x81080001))))))
  {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool isFormatSupported(uint64_t pixelformat, bool only_color)
{
  if (pixelformat == YCbCr411_8 || pixelformat == YCbCr422_8 || pixelformat == YUV422_8 ||
    pixelformat == RGB8 || pixelformat == BayerRG8 || pixelformat == BayerBG8 ||
    pixelformat == BayerGR8 || pixelformat == BayerGB8)
  {
    return true;
  }

  if (!only_color && (pixelformat == Mono8 || pixelformat == Confidence8 ||
    pixelformat == Error8))
  {
    return true;
  }

  return false;
}